

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 vector<int,_std::allocator<int>_> *msgs,size_t size,int root,comm *comm)

{
  int iVar1;
  size_type sVar2;
  const_reference msgs_00;
  comm *comm_local;
  int root_local;
  size_t size_local;
  vector<int,_std::allocator<int>_> *msgs_local;
  vector<int,_std::allocator<int>_> *result;
  
  iVar1 = mxx::comm::rank(comm);
  if (iVar1 == root) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(msgs);
    iVar1 = mxx::comm::size(comm);
    if (sVar2 != size * (long)iVar1) {
      assert_fail("comm.rank() != root || msgs.size() == size*comm.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                  ,0x96,"scatter");
    }
  }
  msgs_00 = std::vector<int,_std::allocator<int>_>::operator[](msgs,0);
  scatter<int>(__return_storage_ptr__,msgs_00,size,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const std::vector<T>& msgs, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == size*comm.size());
    std::vector<T> result = scatter(&msgs[0], size, root, comm);
    return result;
}